

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O0

Vec_Int_t * Gia_RsbWindowInit(Gia_Man_t *p,Vec_Int_t *vPaths,int iPivot,int nIter)

{
  Vec_Int_t *vPaths_00;
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int local_48;
  int iNext;
  int iNode;
  int iMeet;
  int iFan;
  int iStart;
  int n;
  int i;
  Gia_Obj_t *pPivot;
  Vec_Int_t *vVisited;
  int nIter_local;
  int iPivot_local;
  Vec_Int_t *vPaths_local;
  Gia_Man_t *p_local;
  
  vVisited._0_4_ = nIter;
  vVisited._4_4_ = iPivot;
  _nIter_local = vPaths;
  vPaths_local = (Vec_Int_t *)p;
  pPivot = (Gia_Obj_t *)Vec_IntAlloc(100);
  _n = Gia_ManObj((Gia_Man_t *)vPaths_local,vVisited._4_4_);
  iMeet = 0;
  iVar1 = Gia_ObjIsAnd(_n);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsAnd(pPivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x31a,"Vec_Int_t *Gia_RsbWindowInit(Gia_Man_t *, Vec_Int_t *, int, int)");
  }
  for (iFan = 0; iFan < 2; iFan = iFan + 1) {
    iNode = Gia_ObjFaninId(_n,vVisited._4_4_,iFan);
    Gia_ManIncrementTravId((Gia_Man_t *)vPaths_local);
    Vec_IntPush((Vec_Int_t *)pPivot,iNode);
    Vec_IntWriteEntry(_nIter_local,iNode,0);
    Gia_ObjSetTravIdCurrentId((Gia_Man_t *)vPaths_local,iNode);
  }
  iStart = 0;
  do {
    if ((int)vVisited <= iStart) {
LAB_009e1e50:
      if (iStart == (int)vVisited) {
        Vec_IntFreeP((Vec_Int_t **)&pPivot);
      }
      return (Vec_Int_t *)pPivot;
    }
    iVar1 = Vec_IntSize((Vec_Int_t *)pPivot);
    iVar2 = Gia_RsbWindowExplore
                      ((Gia_Man_t *)vPaths_local,(Vec_Int_t *)pPivot,iMeet,_nIter_local,&iNext,
                       &local_48);
    if (iVar2 != 0) {
      iVar1 = Gia_ObjIsTravIdCurrentId((Gia_Man_t *)vPaths_local,iNext);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsTravIdPreviousId((Gia_Man_t *)vPaths_local,iNext);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                        ,0x32f,"Vec_Int_t *Gia_RsbWindowInit(Gia_Man_t *, Vec_Int_t *, int, int)");
        }
        iVar1 = Gia_ObjIsTravIdCurrentId((Gia_Man_t *)vPaths_local,local_48);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsTravIdCurrentId(p, iNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                        ,0x32e,"Vec_Int_t *Gia_RsbWindowInit(Gia_Man_t *, Vec_Int_t *, int, int)");
        }
      }
      else {
        iVar1 = Gia_ObjIsTravIdPreviousId((Gia_Man_t *)vPaths_local,local_48);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsTravIdPreviousId(p, iNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                        ,0x32c,"Vec_Int_t *Gia_RsbWindowInit(Gia_Man_t *, Vec_Int_t *, int, int)");
        }
      }
      Vec_IntClear((Vec_Int_t *)pPivot);
      p_00 = vPaths_local;
      vPaths_00 = _nIter_local;
      iVar1 = Vec_IntEntry(_nIter_local,iNext);
      Gia_RsbWindowGather((Gia_Man_t *)p_00,vPaths_00,iVar1,(Vec_Int_t *)pPivot);
      Gia_RsbWindowGather((Gia_Man_t *)vPaths_local,_nIter_local,local_48,(Vec_Int_t *)pPivot);
      Vec_IntPush((Vec_Int_t *)pPivot,vVisited._4_4_);
      goto LAB_009e1e50;
    }
    iStart = iStart + 1;
    iMeet = iVar1;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_RsbWindowInit( Gia_Man_t * p, Vec_Int_t * vPaths, int iPivot, int nIter )
{
    Vec_Int_t * vVisited = Vec_IntAlloc( 100 );
    Gia_Obj_t * pPivot = Gia_ManObj( p, iPivot ); 
    int i, n, iStart = 0;
    assert( Gia_ObjIsAnd(pPivot) );
    // start paths for both fanins of the pivot node
    for ( n = 0; n < 2; n++ )
    {
        int iFan = Gia_ObjFaninId( pPivot, iPivot, n );
        Gia_ManIncrementTravId(p);
        Vec_IntPush( vVisited, iFan );
        Vec_IntWriteEntry( vPaths, iFan, 0 ); 
        Gia_ObjSetTravIdCurrentId( p, iFan );
    }
    // perform several iterations of breadth-first search
    for ( i = 0; i < nIter; i++ )
    {
        int iMeet, iNode, iNext = Vec_IntSize(vVisited);
        if ( Gia_RsbWindowExplore( p, vVisited, iStart, vPaths, &iMeet, &iNode ) )
        {
            // found the shared path
            if ( Gia_ObjIsTravIdCurrentId(p, iMeet) )
                assert( Gia_ObjIsTravIdPreviousId(p, iNode) );
            else if ( Gia_ObjIsTravIdPreviousId(p, iMeet) )
                assert( Gia_ObjIsTravIdCurrentId(p, iNode) );
            else assert( 0 );
            // collect the initial window
            Vec_IntClear( vVisited );
            Gia_RsbWindowGather( p, vPaths, Vec_IntEntry(vPaths, iMeet), vVisited );
            Gia_RsbWindowGather( p, vPaths, iNode, vVisited );
            Vec_IntPush( vVisited, iPivot );
            break;
        }
        iStart = iNext;
    }
    // if no meeting point is found, make sure to return NULL
    if ( i == nIter )
        Vec_IntFreeP( &vVisited );
    return vVisited;
}